

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_sequences.c
# Opt level: O0

symbolEncodingType_e
ZSTD_selectEncodingType
          (FSE_repeat *repeatMode,uint *count,uint max,size_t mostFrequent,size_t nbSeq,uint FSELog,
          FSE_CTable *prevCTable,short *defaultNorm,U32 defaultNormLog,
          ZSTD_defaultPolicy_e isDefaultAllowed,ZSTD_strategy strategy)

{
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  ulong local_90;
  ulong local_88;
  size_t compressedCost;
  size_t NCountCost;
  size_t repeatCost;
  size_t basicCost;
  size_t dynamicFse_nbSeq_min;
  size_t baseLog;
  size_t mult;
  size_t staticFse_nbSeq_max;
  uint FSELog_local;
  size_t nbSeq_local;
  size_t mostFrequent_local;
  uint max_local;
  uint *count_local;
  FSE_repeat *repeatMode_local;
  
  if (mostFrequent == nbSeq) {
    *repeatMode = FSE_repeat_none;
    if ((isDefaultAllowed != ZSTD_defaultDisallowed) && (nbSeq < 3)) {
      return set_basic;
    }
    return set_rle;
  }
  if (strategy < ZSTD_lazy) {
    if (isDefaultAllowed != ZSTD_defaultDisallowed) {
      if ((*repeatMode == FSE_repeat_valid) && (nbSeq < 1000)) {
        return set_repeat;
      }
      if ((nbSeq < (1L << ((byte)defaultNormLog & 0x3f)) * (ulong)(10 - strategy) >> 3) ||
         (mostFrequent < nbSeq >> ((byte)defaultNormLog - 1 & 0x3f))) {
        *repeatMode = FSE_repeat_none;
        return set_basic;
      }
    }
  }
  else {
    if (isDefaultAllowed == ZSTD_defaultDisallowed) {
      local_88 = 0xffffffffffffffff;
    }
    else {
      local_88 = ZSTD_crossEntropyCost(defaultNorm,defaultNormLog,count,max);
    }
    if (*repeatMode == FSE_repeat_none) {
      local_90 = 0xffffffffffffffff;
    }
    else {
      local_90 = ZSTD_fseBitCost(prevCTable,count,max);
    }
    sVar1 = ZSTD_NCountCost(count,max,nbSeq,FSELog);
    sVar2 = ZSTD_entropyCost(count,max,nbSeq);
    uVar3 = sVar1 * 8 + sVar2;
    if ((local_88 <= local_90) && (local_88 <= uVar3)) {
      *repeatMode = FSE_repeat_none;
      return set_basic;
    }
    if (local_90 <= uVar3) {
      return set_repeat;
    }
  }
  *repeatMode = FSE_repeat_check;
  return set_compressed;
}

Assistant:

symbolEncodingType_e
ZSTD_selectEncodingType(
        FSE_repeat* repeatMode, unsigned const* count, unsigned const max,
        size_t const mostFrequent, size_t nbSeq, unsigned const FSELog,
        FSE_CTable const* prevCTable,
        short const* defaultNorm, U32 defaultNormLog,
        ZSTD_defaultPolicy_e const isDefaultAllowed,
        ZSTD_strategy const strategy)
{
    ZSTD_STATIC_ASSERT(ZSTD_defaultDisallowed == 0 && ZSTD_defaultAllowed != 0);
    if (mostFrequent == nbSeq) {
        *repeatMode = FSE_repeat_none;
        if (isDefaultAllowed && nbSeq <= 2) {
            /* Prefer set_basic over set_rle when there are 2 or less symbols,
             * since RLE uses 1 byte, but set_basic uses 5-6 bits per symbol.
             * If basic encoding isn't possible, always choose RLE.
             */
            DEBUGLOG(5, "Selected set_basic");
            return set_basic;
        }
        DEBUGLOG(5, "Selected set_rle");
        return set_rle;
    }
    if (strategy < ZSTD_lazy) {
        if (isDefaultAllowed) {
            size_t const staticFse_nbSeq_max = 1000;
            size_t const mult = 10 - strategy;
            size_t const baseLog = 3;
            size_t const dynamicFse_nbSeq_min = (((size_t)1 << defaultNormLog) * mult) >> baseLog;  /* 28-36 for offset, 56-72 for lengths */
            assert(defaultNormLog >= 5 && defaultNormLog <= 6);  /* xx_DEFAULTNORMLOG */
            assert(mult <= 9 && mult >= 7);
            if ( (*repeatMode == FSE_repeat_valid)
              && (nbSeq < staticFse_nbSeq_max) ) {
                DEBUGLOG(5, "Selected set_repeat");
                return set_repeat;
            }
            if ( (nbSeq < dynamicFse_nbSeq_min)
              || (mostFrequent < (nbSeq >> (defaultNormLog-1))) ) {
                DEBUGLOG(5, "Selected set_basic");
                /* The format allows default tables to be repeated, but it isn't useful.
                 * When using simple heuristics to select encoding type, we don't want
                 * to confuse these tables with dictionaries. When running more careful
                 * analysis, we don't need to waste time checking both repeating tables
                 * and default tables.
                 */
                *repeatMode = FSE_repeat_none;
                return set_basic;
            }
        }
    } else {
        size_t const basicCost = isDefaultAllowed ? ZSTD_crossEntropyCost(defaultNorm, defaultNormLog, count, max) : ERROR(GENERIC);
        size_t const repeatCost = *repeatMode != FSE_repeat_none ? ZSTD_fseBitCost(prevCTable, count, max) : ERROR(GENERIC);
        size_t const NCountCost = ZSTD_NCountCost(count, max, nbSeq, FSELog);
        size_t const compressedCost = (NCountCost << 3) + ZSTD_entropyCost(count, max, nbSeq);

        if (isDefaultAllowed) {
            assert(!ZSTD_isError(basicCost));
            assert(!(*repeatMode == FSE_repeat_valid && ZSTD_isError(repeatCost)));
        }
        assert(!ZSTD_isError(NCountCost));
        assert(compressedCost < ERROR(maxCode));
        DEBUGLOG(5, "Estimated bit costs: basic=%u\trepeat=%u\tcompressed=%u",
                    (unsigned)basicCost, (unsigned)repeatCost, (unsigned)compressedCost);
        if (basicCost <= repeatCost && basicCost <= compressedCost) {
            DEBUGLOG(5, "Selected set_basic");
            assert(isDefaultAllowed);
            *repeatMode = FSE_repeat_none;
            return set_basic;
        }
        if (repeatCost <= compressedCost) {
            DEBUGLOG(5, "Selected set_repeat");
            assert(!ZSTD_isError(repeatCost));
            return set_repeat;
        }
        assert(compressedCost < basicCost && compressedCost < repeatCost);
    }
    DEBUGLOG(5, "Selected set_compressed");
    *repeatMode = FSE_repeat_check;
    return set_compressed;
}